

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

int duckdb_lz4::LZ4_decompress_unsafe_generic
              (BYTE *istart,BYTE *ostart,int decompressedSize,size_t prefixSize,BYTE *dictStart,
              size_t dictSize)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  uint uVar7;
  size_t l;
  long lVar8;
  ulong uVar9;
  ushort *puVar10;
  ushort *__src;
  ulong uVar11;
  BYTE *__src_00;
  size_t l_1;
  BYTE *__n;
  BYTE *pBVar12;
  char cVar13;
  int local_50;
  
  pBVar12 = ostart + decompressedSize;
  lVar4 = (long)ostart - prefixSize;
  puVar10 = (ushort *)istart;
  do {
    uVar2 = *puVar10;
    __src = (ushort *)((long)puVar10 + 1);
    uVar7 = (uint)(byte)((byte)uVar2 >> 4);
    uVar9 = (ulong)uVar7;
    if (uVar7 == 0xf) {
      lVar8 = 0;
      do {
        uVar3 = *__src;
        __src = (ushort *)((long)__src + 1);
        lVar8 = lVar8 + (ulong)(byte)uVar3;
      } while ((ulong)(byte)uVar3 == 0xff);
      uVar9 = lVar8 + 0xf;
    }
    cVar13 = '\0';
    if ((ulong)((long)pBVar12 - (long)ostart) < uVar9) {
      cVar13 = '\x01';
LAB_01c08599:
      bVar1 = false;
    }
    else {
      memmove(ostart,__src,uVar9);
      ostart = ostart + uVar9;
      __src = (ushort *)((long)__src + uVar9);
      bVar1 = true;
      if ((ulong)((long)pBVar12 - (long)ostart) < 0xc) {
        cVar13 = (ostart == pBVar12) * '\x02' + '\x01';
        goto LAB_01c08599;
      }
    }
    puVar10 = __src;
    if (bVar1) {
      uVar9 = (ulong)((byte)uVar2 & 0xf);
      puVar10 = __src + 1;
      if (uVar9 == 0xf) {
        lVar8 = 0;
        do {
          uVar2 = *puVar10;
          puVar10 = (ushort *)((long)puVar10 + 1);
          lVar8 = lVar8 + (ulong)(byte)uVar2;
        } while ((ulong)(byte)uVar2 == 0xff);
        uVar9 = lVar8 + 0xf;
      }
      __n = (BYTE *)(uVar9 + 4);
      cVar13 = '\x01';
      if (__n <= pBVar12 + -(long)ostart) {
        uVar9 = (ulong)*__src;
        uVar11 = (long)ostart - lVar4;
        if (uVar9 <= uVar11 + dictSize) {
          if (uVar11 < uVar9) {
            __src_00 = dictStart + (uVar11 - uVar9) + dictSize;
            pBVar6 = dictStart + (dictSize - (long)__src_00);
            pBVar5 = __n + -(long)pBVar6;
            if (__n < pBVar6) {
              memmove(ostart,__src_00,(size_t)__n);
              pBVar5 = (BYTE *)0x0;
              pBVar6 = __n;
            }
            else {
              memmove(ostart,__src_00,(size_t)pBVar6);
            }
            ostart = ostart + (long)pBVar6;
            lVar8 = lVar4;
            __n = pBVar5;
          }
          else {
            lVar8 = (long)ostart - uVar9;
          }
          if (__n != (BYTE *)0x0) {
            pBVar6 = (BYTE *)0x0;
            do {
              ostart[(long)pBVar6] = pBVar6[lVar8];
              pBVar6 = pBVar6 + 1;
            } while (__n != pBVar6);
          }
        }
        if (uVar9 <= uVar11 + dictSize) {
          ostart = ostart + (long)__n;
          cVar13 = (ulong)((long)pBVar12 - (long)ostart) < 5;
        }
      }
    }
    if (cVar13 != '\0') {
      if (cVar13 == '\x03') {
        local_50 = (int)istart;
        local_50 = (int)puVar10 - local_50;
      }
      else {
        local_50 = -1;
      }
      return local_50;
    }
  } while( true );
}

Assistant:

LZ4_FORCE_INLINE int
LZ4_decompress_unsafe_generic(
                 const BYTE* const istart,
                 BYTE* const ostart,
                 int decompressedSize,

                 size_t prefixSize,
                 const BYTE* const dictStart,  /* only if dict==usingExtDict */
                 const size_t dictSize         /* note: =0 if dictStart==NULL */
                 )
{
    const BYTE* ip = istart;
    BYTE* op = (BYTE*)ostart;
    BYTE* const oend = ostart + decompressedSize;
    const BYTE* const prefixStart = ostart - prefixSize;

    DEBUGLOG(5, "LZ4_decompress_unsafe_generic");
    if (dictStart == NULL) assert(dictSize == 0);

    while (1) {
        /* start new sequence */
        unsigned token = *ip++;

        /* literals */
        {   size_t ll = token >> ML_BITS;
            if (ll==15) {
                /* long literal length */
                ll += read_long_length_no_check(&ip);
            }
            if ((size_t)(oend-op) < ll) return -1; /* output buffer overflow */
            LZ4_memmove(op, ip, ll); /* support in-place decompression */
            op += ll;
            ip += ll;
            if ((size_t)(oend-op) < MFLIMIT) {
                if (op==oend) break;  /* end of block */
                DEBUGLOG(5, "invalid: literals end at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must start at least MFLIMIT==12 bytes before end of output block */
                return -1;
        }   }

        /* match */
        {   size_t ml = token & 15;
            size_t const offset = LZ4_readLE16(ip);
            ip+=2;

            if (ml==15) {
                /* long literal length */
                ml += read_long_length_no_check(&ip);
            }
            ml += MINMATCH;

            if ((size_t)(oend-op) < ml) return -1; /* output buffer overflow */

            {   const BYTE* match = op - offset;

                /* out of range */
                if (offset > (size_t)(op - prefixStart) + dictSize) {
                    DEBUGLOG(6, "offset out of range");
                    return -1;
                }

                /* check special case : extDict */
                if (offset > (size_t)(op - prefixStart)) {
                    /* extDict scenario */
                    const BYTE* const dictEnd = dictStart + dictSize;
                    const BYTE* extMatch = dictEnd - (offset - (size_t)(op-prefixStart));
                    size_t const extml = (size_t)(dictEnd - extMatch);
                    if (extml > ml) {
                        /* match entirely within extDict */
                        LZ4_memmove(op, extMatch, ml);
                        op += ml;
                        ml = 0;
                    } else {
                        /* match split between extDict & prefix */
                        LZ4_memmove(op, extMatch, extml);
                        op += extml;
                        ml -= extml;
                    }
                    match = prefixStart;
                }

                /* match copy - slow variant, supporting overlap copy */
                {   size_t u;
                    for (u=0; u<ml; u++) {
                        op[u] = match[u];
            }   }   }
            op += ml;
            if ((size_t)(oend-op) < LASTLITERALS) {
                DEBUGLOG(5, "invalid: match ends at distance %zi from end of block", oend-op);
                /* incorrect end of block :
                 * last match must stop at least LASTLITERALS==5 bytes before end of output block */
                return -1;
            }
        } /* match */
    } /* main loop */
    return (int)(ip - istart);
}